

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

void __thiscall
MockSupport::setMockFailureStandardReporter(MockSupport *this,MockFailureReporter *reporter)

{
  MockSupport *pMVar1;
  MockFailureReporter *local_30;
  MockNamedValueListNode *local_20;
  MockNamedValueListNode *p;
  MockFailureReporter *reporter_local;
  MockSupport *this_local;
  
  local_30 = reporter;
  if (reporter == (MockFailureReporter *)0x0) {
    local_30 = &this->defaultReporter_;
  }
  this->standardReporter_ = local_30;
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x32])
              (this->lastActualFunctionCall_,this->standardReporter_);
  }
  for (local_20 = MockNamedValueList::begin(&this->data_); local_20 != (MockNamedValueListNode *)0x0
      ; local_20 = MockNamedValueListNode::next(local_20)) {
    pMVar1 = getMockSupport(this,local_20);
    if (pMVar1 != (MockSupport *)0x0) {
      pMVar1 = getMockSupport(this,local_20);
      (*pMVar1->_vptr_MockSupport[0x29])(pMVar1,this->standardReporter_);
    }
  }
  return;
}

Assistant:

void MockSupport::setMockFailureStandardReporter(MockFailureReporter* reporter)
{
    standardReporter_ = (reporter != NULLPTR) ? reporter : &defaultReporter_;

    if (lastActualFunctionCall_)
        lastActualFunctionCall_->setMockFailureReporter(standardReporter_);

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p)) getMockSupport(p)->setMockFailureStandardReporter(standardReporter_);
}